

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

void __thiscall
pbrt::ParameterDictionary::ParameterDictionary
          (ParameterDictionary *this,ParsedParameterVector *p,RGBColorSpace *colorSpace)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar2;
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&this->params,p);
  this->colorSpace = colorSpace;
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  paVar2 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar2 = paVar1;
  }
  std::__reverse<pbrt::ParsedParameter**>(paVar2,(long)paVar2 + (this->params).nStored * 8);
  if (colorSpace != (RGBColorSpace *)0x0) {
    checkParameterTypes(this);
    return;
  }
  LogFatal<char_const(&)[22]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/paramdict.cpp"
             ,0xa1,"Check failed: %s",(char (*) [22])0x582106);
}

Assistant:

ParameterDictionary::ParameterDictionary(ParsedParameterVector p,
                                         const RGBColorSpace *colorSpace)
    : params(std::move(p)), colorSpace(colorSpace) {
    std::reverse(params.begin(), params.end());
    CHECK(colorSpace != nullptr);
    checkParameterTypes();
}